

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::EndPhase(Func *this,Phase tag,bool dump)

{
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode executionMode;
  uint uVar4;
  uint uVar5;
  Func *in_RAX;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  char *pcVar8;
  undefined4 *puVar9;
  undefined7 in_register_00000011;
  DbCheckPostLower local_38;
  DbCheckPostLower dbCheck;
  
  local_38.func = in_RAX;
  EndProfiler(this,tag);
  if ((int)CONCAT71(in_register_00000011,dump) != 0) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,tag,uVar4,uVar5);
    if (!bVar3) {
      pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
      uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
      pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,BackEndPhase,uVar4,uVar5);
      if (!bVar3) goto LAB_0042eb3a;
    }
    Output::Print(L"-----------------------------------------------------------------------------\n"
                 );
    bVar3 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
    uVar1 = (&Js::PhaseNames)[tag];
    executionMode = JITTimeWorkItem::GetJitMode(this->m_workItem);
    pcVar8 = ExecutionModeName(executionMode);
    if (bVar3) {
      uVar4 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
      Output::Print(L"************   IR after %s (%S) Loop %d ************\n",uVar1,pcVar8,
                    (ulong)uVar4);
    }
    else {
      Output::Print(L"************   IR after %s (%S)  ************\n",uVar1,pcVar8);
    }
    Dump(this,(uint)DAT_015aa2cf);
  }
LAB_0042eb3a:
  if (tag == RegAllocPhase) {
    this->field_0x242 = this->field_0x242 | 8;
  }
  if (tag == LowererPhase) {
    if ((this->field_0x242 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x534,"(!this->isPostLower)","!this->isPostLower");
      if (!bVar3) {
LAB_0042eddc:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    this->field_0x242 = this->field_0x242 | 0x20;
    local_38.func = this;
    DbCheckPostLower::CheckNestedHelperCalls(&local_38);
  }
  else if (tag == RegAllocPhase) {
    if ((this->field_0x242 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x53d,"(!this->isPostRegAlloc)","!this->isPostRegAlloc");
      if (!bVar3) goto LAB_0042eddc;
      *puVar9 = 0;
    }
    this->field_0x242 = this->field_0x242 | 0x40;
  }
  else if (tag == FinalLowerPhase) {
    if ((*(uint *)&this->field_0x240 & 0x3000000) != 0x1000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x54c,"(this->isPostLayout && !this->isPostFinalLower)",
                         "this->isPostLayout && !this->isPostFinalLower");
      if (!bVar3) goto LAB_0042eddc;
      *puVar9 = 0;
    }
    this->field_0x243 = this->field_0x243 | 2;
  }
  else if (tag == LayoutPhase) {
    if ((*(uint *)&this->field_0x240 & 0x1800000) != 0x800000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x547,"(this->isPostPeeps && !this->isPostLayout)",
                         "this->isPostPeeps && !this->isPostLayout");
      if (!bVar3) goto LAB_0042eddc;
      *puVar9 = 0;
    }
    this->field_0x243 = this->field_0x243 | 1;
  }
  else if (tag == PeepsPhase) {
    if ((*(uint *)&this->field_0x240 & 0x1200000) != 0x200000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x542,"(this->isPostLower && !this->isPostLayout)",
                         "this->isPostLower && !this->isPostLayout");
      if (!bVar3) goto LAB_0042eddc;
      *puVar9 = 0;
    }
    this->field_0x242 = this->field_0x242 | 0x80;
  }
  if ((this->field_0x242 & 0x20) != 0) {
    local_38.func = this;
    DbCheckPostLower::Check(&local_38);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::MergeDelayFreeList
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this->m_alloc);
  return;
}

Assistant:

void
Func::EndPhase(Js::Phase tag, bool dump)
{
    this->EndProfiler(tag);
#if DBG_DUMP
    if(dump && (PHASE_DUMP(tag, this)
        || PHASE_DUMP(Js::BackEndPhase, this)))
    {
        Output::Print(_u("-----------------------------------------------------------------------------\n"));

        if (IsLoopBody())
        {
            Output::Print(_u("************   IR after %s (%S) Loop %d ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()),
                m_workItem->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("************   IR after %s (%S)  ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()));
        }
        this->Dump(Js::Configuration::Global.flags.AsmDiff? IRDumpFlags_AsmDumpMode : IRDumpFlags_None);
    }
#endif

    if (tag == Js::RegAllocPhase)
    {
        this->legalizePostRegAlloc = true;
    }

#if DBG
    if (tag == Js::LowererPhase)
    {
        Assert(!this->isPostLower);
        this->isPostLower = true;
#if !defined(_M_ARM) && !defined(_M_ARM64) // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);
        dbCheck.CheckNestedHelperCalls();
#endif
    }
    else if (tag == Js::RegAllocPhase)
    {
        Assert(!this->isPostRegAlloc);
        this->isPostRegAlloc = true;
    }
    else if (tag == Js::PeepsPhase)
    {
        Assert(this->isPostLower && !this->isPostLayout);
        this->isPostPeeps = true;
    }
    else if (tag == Js::LayoutPhase)
    {
        Assert(this->isPostPeeps && !this->isPostLayout);
        this->isPostLayout = true;
    }
    else if (tag == Js::FinalLowerPhase)
    {
        Assert(this->isPostLayout && !this->isPostFinalLower);
        this->isPostFinalLower = true;
    }
    if (this->isPostLower)
    {
#ifndef _M_ARM    // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);

        dbCheck.Check();
#endif
    }
    this->m_alloc->MergeDelayFreeList();
#endif
}